

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScopedPrinter.h
# Opt level: O0

void __thiscall
llvm::ScopedPrinter::printHex<unsigned_short>
          (ScopedPrinter *this,StringRef Label,unsigned_short Value)

{
  StringRef Str;
  raw_ostream *prVar1;
  HexNumber local_40;
  ScopedPrinter *local_38;
  char *local_30;
  unsigned_short local_22;
  ScopedPrinter *pSStack_20;
  unsigned_short Value_local;
  ScopedPrinter *this_local;
  StringRef Label_local;
  
  Label_local.Data = (char *)Label.Length;
  this_local = (ScopedPrinter *)Label.Data;
  local_22 = Value;
  pSStack_20 = this;
  prVar1 = startLine(this);
  local_38 = this_local;
  local_30 = Label_local.Data;
  Str.Length = (size_t)Label_local.Data;
  Str.Data = (char *)this_local;
  prVar1 = raw_ostream::operator<<(prVar1,Str);
  prVar1 = raw_ostream::operator<<(prVar1,": ");
  local_40 = hex<unsigned_short>(this,local_22);
  prVar1 = llvm::operator<<(prVar1,&local_40);
  raw_ostream::operator<<(prVar1,"\n");
  return;
}

Assistant:

void printHex(StringRef Label, T Value) {
    startLine() << Label << ": " << hex(Value) << "\n";
  }